

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

bool __thiscall
duckdb::ART::Scan(ART *this,IndexScanState *state,idx_t max_count,unsafe_vector<row_t> *row_ids)

{
  vector<duckdb::PhysicalType,_true> *this_00;
  bool bVar1;
  Allocator *allocator;
  reference pvVar2;
  InternalException *this_01;
  pthread_mutex_t *__mutex;
  idx_t max_len;
  allocator local_b1;
  pthread_mutex_t *local_b0;
  ARTKey key;
  ARTKey upper_bound;
  ArenaAllocator arena_allocator;
  
  allocator = Allocator::Get((this->super_BoundIndex).super_Index.db);
  ArenaAllocator::ArenaAllocator(&arena_allocator,allocator,0x800);
  this_00 = &(this->super_BoundIndex).types;
  pvVar2 = vector<duckdb::PhysicalType,_true>::get<true>(this_00,0);
  key = ARTKey::CreateKey(&arena_allocator,*pvVar2,(Value *)(state + 1));
  max_len = (ulong)this->prefix_count << 0xd;
  ARTKey::VerifyKeyLength(&key,max_len);
  __mutex = (pthread_mutex_t *)&(this->super_BoundIndex).lock;
  if (*(char *)&state[0xc]._vptr_IndexScanState == '\x01') {
    ::std::mutex::lock((mutex *)&__mutex->__data);
    bVar1 = true;
    switch(*(undefined1 *)&state[0x11]._vptr_IndexScanState) {
    case 0x19:
      bVar1 = SearchEqual(this,&key,max_count,row_ids);
      break;
    default:
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&upper_bound,"Index scan type not implemented",&local_b1);
      InternalException::InternalException(this_01,(string *)&upper_bound);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case 0x1b:
      bVar1 = false;
    case 0x1d:
      bVar1 = SearchLess(this,&key,bVar1,max_count,row_ids);
      break;
    case 0x1c:
      bVar1 = false;
    case 0x1e:
      bVar1 = SearchGreater(this,&key,bVar1,max_count,row_ids);
    }
  }
  else {
    local_b0 = __mutex;
    ::std::mutex::lock((mutex *)&__mutex->__data);
    pvVar2 = vector<duckdb::PhysicalType,_true>::get<true>(this_00,0);
    upper_bound = ARTKey::CreateKey(&arena_allocator,*pvVar2,(Value *)(state + 9));
    ARTKey::VerifyKeyLength(&upper_bound,max_len);
    bVar1 = SearchCloseRange(this,&key,&upper_bound,
                             *(char *)&state[0x11]._vptr_IndexScanState == '\x1e',
                             *(char *)((long)&state[0x11]._vptr_IndexScanState + 1) == '\x1d',
                             max_count,row_ids);
    __mutex = local_b0;
  }
  pthread_mutex_unlock(__mutex);
  ArenaAllocator::~ArenaAllocator(&arena_allocator);
  return bVar1;
}

Assistant:

bool ART::Scan(IndexScanState &state, const idx_t max_count, unsafe_vector<row_t> &row_ids) {
	auto &scan_state = state.Cast<ARTIndexScanState>();
	D_ASSERT(scan_state.values[0].type().InternalType() == types[0]);
	ArenaAllocator arena_allocator(Allocator::Get(db));
	auto key = ARTKey::CreateKey(arena_allocator, types[0], scan_state.values[0]);
	auto max_len = MAX_KEY_LEN * prefix_count;
	key.VerifyKeyLength(max_len);

	if (scan_state.values[1].IsNull()) {
		// Single predicate.
		lock_guard<mutex> l(lock);
		switch (scan_state.expressions[0]) {
		case ExpressionType::COMPARE_EQUAL:
			return SearchEqual(key, max_count, row_ids);
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
			return SearchGreater(key, true, max_count, row_ids);
		case ExpressionType::COMPARE_GREATERTHAN:
			return SearchGreater(key, false, max_count, row_ids);
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
			return SearchLess(key, true, max_count, row_ids);
		case ExpressionType::COMPARE_LESSTHAN:
			return SearchLess(key, false, max_count, row_ids);
		default:
			throw InternalException("Index scan type not implemented");
		}
	}

	// Two predicates.
	lock_guard<mutex> l(lock);
	D_ASSERT(scan_state.values[1].type().InternalType() == types[0]);
	auto upper_bound = ARTKey::CreateKey(arena_allocator, types[0], scan_state.values[1]);
	upper_bound.VerifyKeyLength(max_len);

	bool left_equal = scan_state.expressions[0] == ExpressionType ::COMPARE_GREATERTHANOREQUALTO;
	bool right_equal = scan_state.expressions[1] == ExpressionType ::COMPARE_LESSTHANOREQUALTO;
	return SearchCloseRange(key, upper_bound, left_equal, right_equal, max_count, row_ids);
}